

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_utils.c
# Opt level: O0

int WebPRescalerImport(WebPRescaler *rescaler,int num_lines,uint8_t *src,int src_stride)

{
  undefined8 uVar1;
  int iVar2;
  int in_ESI;
  long in_RDI;
  int x;
  rescaler_t *tmp;
  int total_imported;
  uint8_t *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  uint uVar3;
  int in_stack_ffffffffffffffd4;
  undefined4 local_20;
  
  local_20 = 0;
  while( true ) {
    uVar3 = in_stack_ffffffffffffffd0 & 0xffffff;
    if (local_20 < in_ESI) {
      iVar2 = WebPRescalerHasPendingOutput
                        ((WebPRescaler *)
                         (CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0) &
                         0xffffffff00ffffff));
      uVar3 = CONCAT13(iVar2 != 0,(int3)uVar3) ^ 0xff000000;
    }
    in_stack_ffffffffffffffd0 = uVar3;
    if ((in_stack_ffffffffffffffd0 & 0x1000000) == 0) break;
    if (*(int *)(in_RDI + 4) != 0) {
      uVar1 = *(undefined8 *)(in_RDI + 0x58);
      *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)(in_RDI + 0x60);
      *(undefined8 *)(in_RDI + 0x60) = uVar1;
    }
    WebPRescalerImportRow
              ((WebPRescaler *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    if (*(int *)(in_RDI + 4) == 0) {
      for (in_stack_ffffffffffffffd4 = 0;
          in_stack_ffffffffffffffd4 < *(int *)(in_RDI + 8) * *(int *)(in_RDI + 0x34);
          in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
        *(int *)(*(long *)(in_RDI + 0x58) + (long)in_stack_ffffffffffffffd4 * 4) =
             *(int *)(*(long *)(in_RDI + 0x60) + (long)in_stack_ffffffffffffffd4 * 4) +
             *(int *)(*(long *)(in_RDI + 0x58) + (long)in_stack_ffffffffffffffd4 * 4);
      }
    }
    *(int *)(in_RDI + 0x3c) = *(int *)(in_RDI + 0x3c) + 1;
    local_20 = local_20 + 1;
    *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) - *(int *)(in_RDI + 0x20);
  }
  return local_20;
}

Assistant:

int WebPRescalerImport(WebPRescaler* const rescaler, int num_lines,
                       const uint8_t* src, int src_stride) {
  int total_imported = 0;
  while (total_imported < num_lines &&
         !WebPRescalerHasPendingOutput(rescaler)) {
    if (rescaler->y_expand) {
      rescaler_t* const tmp = rescaler->irow;
      rescaler->irow = rescaler->frow;
      rescaler->frow = tmp;
    }
    WebPRescalerImportRow(rescaler, src);
    if (!rescaler->y_expand) {    // Accumulate the contribution of the new row.
      int x;
      for (x = 0; x < rescaler->num_channels * rescaler->dst_width; ++x) {
        rescaler->irow[x] += rescaler->frow[x];
      }
    }
    ++rescaler->src_y;
    src += src_stride;
    ++total_imported;
    rescaler->y_accum -= rescaler->y_sub;
  }
  return total_imported;
}